

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expression_classes.hpp
# Opt level: O3

void __thiscall
remora::
vector_addition<remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>,remora::vector_scalar_multiply<remora::vector<double,remora::cpu_tag>>>
::assign_to<remora::vector<double,remora::cpu_tag>>
          (vector_addition<remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>,remora::vector_scalar_multiply<remora::vector<double,remora::cpu_tag>>>
           *this,vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *x)

{
  double dVar1;
  void *__s;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  
  __s = *(void **)x;
  if (__s != *(void **)(x + 8)) {
    memset(__s,0,(long)*(void **)(x + 8) - (long)__s & 0xfffffffffffffff8);
  }
  matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>
  ::plus_assign_to<remora::vector<double,remora::cpu_tag>,remora::dense_tag>
            ((matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>
              *)this,x);
  lVar2 = *(long *)x;
  lVar3 = *(long *)(x + 8);
  if (lVar3 - lVar2 != 0) {
    lVar4 = *(long *)(this + 0x68);
    dVar1 = *(double *)(this + 0x70);
    pdVar5 = *(double **)(this + 0x58);
    lVar6 = 0;
    do {
      *(double *)(lVar2 + lVar6 * 8) = *pdVar5 * dVar1 + *(double *)(lVar2 + lVar6 * 8);
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + lVar4;
    } while (lVar3 - lVar2 >> 3 != lVar6);
  }
  return;
}

Assistant:

void assign_to(vector_expression<VecX, device_type>& x)const{
		//working around a bug in non-dense assign
		if(!std::is_base_of<dense_tag, typename E1::evaluation_category::tag>::value){
			x().clear();
			plus_assign(x, m_lhs);
		}else{
			assign(x, m_lhs);
		}
		plus_assign(x,m_rhs);
	}